

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

int __thiscall
tchecker::typed_while_statement_t::clone
          (typed_while_statement_t *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  typed_expression_t *ptVar1;
  typed_statement_t *ptVar2;
  typed_while_statement_t *this_00;
  undefined1 local_30 [8];
  shared_ptr<const_tchecker::typed_statement_t> stmt_clone;
  shared_ptr<const_tchecker::typed_expression_t> cond_clone;
  typed_while_statement_t *this_local;
  
  ptVar1 = condition(this);
  ptVar1 = (typed_expression_t *)(**(code **)(*(long *)ptVar1 + 0x28))();
  std::shared_ptr<tchecker::typed_expression_t_const>::shared_ptr<tchecker::typed_expression_t,void>
            ((shared_ptr<tchecker::typed_expression_t_const> *)
             &stmt_clone.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,ptVar1);
  ptVar2 = statement(this);
  ptVar2 = (typed_statement_t *)(**(code **)(*(long *)ptVar2 + 0x28))();
  std::shared_ptr<tchecker::typed_statement_t_const>::shared_ptr<tchecker::typed_statement_t,void>
            ((shared_ptr<tchecker::typed_statement_t_const> *)local_30,ptVar2);
  this_00 = (typed_while_statement_t *)operator_new(0x38);
  typed_while_statement_t
            (this_00,(this->super_typed_statement_t)._type,
             (shared_ptr<const_tchecker::typed_expression_t> *)
             &stmt_clone.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(shared_ptr<const_tchecker::typed_statement_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_statement_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_statement_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_expression_t> *)
             &stmt_clone.
              super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::typed_while_statement_t * typed_while_statement_t::clone() const
{
  std::shared_ptr<tchecker::typed_expression_t const> cond_clone{condition().clone()};
  std::shared_ptr<tchecker::typed_statement_t const> stmt_clone{statement().clone()};
  return new tchecker::typed_while_statement_t(_type, cond_clone, stmt_clone);
}